

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O2

int __thiscall xmrig::HttpContext::close(HttpContext *this,int __fd)

{
  IHttpListener *pIVar1;
  int iVar2;
  iterator __position;
  uint64_t local_10;
  
  if ((__fd < 0) && (pIVar1 = this->m_listener, pIVar1 != (IHttpListener *)0x0)) {
    (this->super_HttpData).status = __fd;
    (*pIVar1->_vptr_IHttpListener[2])(pIVar1,&this->super_HttpData);
  }
  local_10 = (this->super_HttpData).m_id;
  __position = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_xmrig::HttpContext_*>,_std::_Select1st<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>_>
               ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_xmrig::HttpContext_*>,_std::_Select1st<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>_>
                       *)storage,&local_10);
  if (__position._M_node != (_Base_ptr)(storage + 8)) {
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,xmrig::HttpContext*>,std::_Select1st<std::pair<unsigned_long_const,xmrig::HttpContext*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,xmrig::HttpContext*>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,xmrig::HttpContext*>,std::_Select1st<std::pair<unsigned_long_const,xmrig::HttpContext*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,xmrig::HttpContext*>>>
                        *)storage,__position);
  }
  iVar2 = uv_is_closing(this->m_tcp);
  if (iVar2 == 0) {
    iVar2 = uv_close(this->m_tcp,close::anon_class_1_0_00000001::__invoke);
  }
  return iVar2;
}

Assistant:

void xmrig::HttpContext::close(int status)
{
    if (status < 0 && m_listener) {
        this->status = status;
        m_listener->onHttpData(*this);
    }

    auto it = storage.find(id());
    if (it != storage.end()) {
        storage.erase(it);
    }

    if (!uv_is_closing(handle())) {
        uv_close(handle(), [](uv_handle_t *handle) -> void { delete reinterpret_cast<HttpContext*>(handle->data); });
    }
}